

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_pxr24.c
# Opt level: O0

uint32_t float_to_float24(float f)

{
  uint32_t i;
  uint32_t m;
  uint32_t e;
  uint32_t s;
  anon_union_4_2_947300a4 u;
  float f_local;
  
  if (((uint)f & 0x7f800000) == 0x7f800000) {
    if (((uint)f & 0x7fffff) == 0) {
      i = 0x7f8000;
    }
    else {
      i = (uint)ABS(f) >> 8 | (uint)(((uint)f & 0x7fffff) >> 8 == 0);
    }
  }
  else {
    i = (int)ABS(f) + ((uint)f & 0x80) >> 8;
    if (0x7f7fff < i) {
      i = (uint)ABS(f) >> 8;
    }
  }
  return ((uint)f & 0x80000000) >> 8 | i;
}

Assistant:

static inline uint32_t
float_to_float24 (float f)
{
    union
    {
        float    f;
        uint32_t i;
    } u;
    uint32_t s, e, m, i;

    u.f = f;

    //
    // Disassemble the 32-bit floating point number, f,
    // into sign, s, exponent, e, and significand, m.
    //

    s = u.i & 0x80000000;
    e = u.i & 0x7f800000;
    m = u.i & 0x007fffff;

    if (e == 0x7f800000)
    {
        if (m)
        {
            //
            // F is a NAN; we preserve the sign bit and
            // the 15 leftmost bits of the significand,
            // with one exception: If the 15 leftmost
            // bits are all zero, the NAN would turn
            // into an infinity, so we have to set at
            // least one bit in the significand.
            //

            m >>= 8;
            i = (e >> 8) | m | (m == 0);
        }
        else
        {
            //
            // F is an infinity.
            //

            i = e >> 8;
        }
    }
    else
    {
        //
        // F is finite, round the significand to 15 bits.
        //

        i = ((e | m) + (m & 0x00000080)) >> 8;

        if (i >= 0x7f8000)
        {
            //
            // F was close to FLT_MAX, and the significand was
            // rounded up, resulting in an exponent overflow.
            // Avoid the overflow by truncating the significand
            // instead of rounding it.
            //

            i = (e | m) >> 8;
        }
    }

    return (s >> 8) | i;
}